

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int I010ToARGBMatrix(uint16_t *src_y,int src_stride_y,uint16_t *src_u,int src_stride_u,
                    uint16_t *src_v,int src_stride_v,uint8_t *dst_argb,int dst_stride_argb,
                    YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  code *pcVar2;
  uint uVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  uint local_50;
  
  auVar5._0_4_ = -(uint)(src_y == (uint16_t *)0x0);
  auVar5._4_4_ = -(uint)(src_u == (uint16_t *)0x0);
  auVar5._8_4_ = -(uint)(src_v == (uint16_t *)0x0);
  auVar5._12_4_ = -(uint)(dst_argb == (uint8_t *)0x0);
  iVar1 = movmskps((int)src_u,auVar5);
  if ((height == 0 || width < 1) || iVar1 != 0) {
    iVar1 = -1;
  }
  else {
    if (height < 0) {
      local_50 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    else {
      local_50 = height;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if ((width & 7U) == 0) {
      pcVar2 = I210ToARGBRow_SSSE3;
    }
    else {
      pcVar2 = I210ToARGBRow_Any_SSSE3;
    }
    if (iVar1 == 0) {
      pcVar2 = I210ToARGBRow_C;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar4 = I210ToARGBRow_AVX2;
    }
    else {
      pcVar4 = I210ToARGBRow_Any_AVX2;
    }
    if (iVar1 == 0) {
      pcVar4 = pcVar2;
    }
    for (uVar3 = 0; local_50 != uVar3; uVar3 = uVar3 + 1) {
      (*pcVar4)(src_y,src_u,src_v,dst_argb,yuvconstants,width);
      dst_argb = dst_argb + dst_stride_argb;
      src_v = src_v + (int)(-(uVar3 & 1) & src_stride_v);
      src_u = src_u + (int)(-(uVar3 & 1) & src_stride_u);
      src_y = src_y + src_stride_y;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I010ToARGBMatrix(const uint16_t* src_y,
                     int src_stride_y,
                     const uint16_t* src_u,
                     int src_stride_u,
                     const uint16_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I210ToARGBRow)(const uint16_t* y_buf, const uint16_t* u_buf,
                        const uint16_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I210ToARGBRow_C;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
#if defined(HAS_I210TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I210ToARGBRow = I210ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I210ToARGBRow = I210ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I210TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I210ToARGBRow = I210ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I210ToARGBRow = I210ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I210TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I210ToARGBRow = I210ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I210ToARGBRow = I210ToARGBRow_MMI;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    I210ToARGBRow(src_y, src_u, src_v, dst_argb, yuvconstants, width);
    dst_argb += dst_stride_argb;
    src_y += src_stride_y;
    if (y & 1) {
      src_u += src_stride_u;
      src_v += src_stride_v;
    }
  }
  return 0;
}